

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint64_t helper_neon_rshl_s64_arm(uint64_t valop,uint64_t shiftop)

{
  byte bVar1;
  long lVar2;
  undefined8 local_28;
  int64_t val;
  int8_t shift;
  uint64_t shiftop_local;
  uint64_t valop_local;
  
  bVar1 = (byte)shiftop;
  if (((char)bVar1 < '@') && (-0x40 < (char)bVar1)) {
    if ((char)bVar1 < '\0') {
      lVar2 = (long)valop >> (0xff - bVar1 & 0x3f);
      if (lVar2 == 0x7fffffffffffffff) {
        local_28 = 0x4000000000000000;
      }
      else {
        local_28 = lVar2 + 1 >> 1;
      }
    }
    else {
      local_28 = valop << (bVar1 & 0x3f);
    }
  }
  else {
    local_28 = 0;
  }
  return local_28;
}

Assistant:

uint64_t HELPER(neon_rshl_s64)(uint64_t valop, uint64_t shiftop)
{
    int8_t shift = (int8_t)shiftop;
    int64_t val = valop;
    if ((shift >= 64) || (shift <= -64)) {
        val = 0;
    } else if (shift < 0) {
        val >>= (-shift - 1);
        if (val == INT64_MAX) {
            /* In this case, it means that the rounding constant is 1,
             * and the addition would overflow. Return the actual
             * result directly.  */
            val = 0x4000000000000000LL;
        } else {
            val++;
            val >>= 1;
        }
    } else {
        val <<= shift;
    }
    return val;
}